

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_vertex.cxx
# Opt level: O2

void __thiscall Fl_Graphics_Driver::circle(Fl_Graphics_Driver *this,double x,double y,double r)

{
  code *pcVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  dVar2 = (this->m).a;
  dVar7 = (this->m).b;
  dVar3 = (this->m).c;
  if ((dVar3 != 0.0) || (NAN(dVar3))) {
    dVar6 = SQRT(dVar2 * dVar2 + dVar3 * dVar3);
  }
  else {
    dVar6 = ABS(dVar2);
  }
  dVar5 = (this->m).d;
  if ((dVar7 != 0.0) || (NAN(dVar7))) {
    dVar4 = SQRT(dVar7 * dVar7 + dVar5 * dVar5);
  }
  else {
    dVar4 = ABS(dVar5);
  }
  dVar5 = (this->m).y + dVar7 * x + dVar5 * y;
  dVar7 = (this->m).x + dVar2 * x + dVar3 * y;
  dVar2 = rint(dVar7 - dVar6 * r);
  dVar7 = rint(dVar6 * r + dVar7);
  dVar3 = rint(dVar5 - dVar4 * r);
  dVar6 = rint(dVar4 * r + dVar5);
  if (this->what == 2) {
    pcVar1 = XFillArc;
  }
  else {
    pcVar1 = XDrawArc;
  }
  (*pcVar1)(fl_display,fl_window,fl_gc,(int)dVar2,(int)dVar3,(int)dVar7 - (int)dVar2,
            (int)dVar6 - (int)dVar3,0,0x5a00);
  return;
}

Assistant:

void Fl_Graphics_Driver::circle(double x, double y,double r) {
  double xt = transform_x(x,y);
  double yt = transform_y(x,y);
  double rx = r * (m.c ? sqrt(m.a*m.a+m.c*m.c) : fabs(m.a));
  double ry = r * (m.b ? sqrt(m.b*m.b+m.d*m.d) : fabs(m.d));
  int llx = (int)rint(xt-rx);
  int w = (int)rint(xt+rx)-llx;
  int lly = (int)rint(yt-ry);
  int h = (int)rint(yt+ry)-lly;

#if defined(USE_X11)
  (what == POLYGON ? XFillArc : XDrawArc)
    (fl_display, fl_window, fl_gc, llx, lly, w, h, 0, 360*64);
#elif defined(WIN32)
  if (what==POLYGON) {
    SelectObject(fl_gc, fl_brush());
    Pie(fl_gc, llx, lly, llx+w, lly+h, 0,0, 0,0); 
  } else
    Arc(fl_gc, llx, lly, llx+w, lly+h, 0,0, 0,0); 
#elif defined(__APPLE_QUARTZ__)
  // Quartz warning: circle won't scale to current matrix!
  // Last argument must be 0 (counter-clockwise) or it draws nothing under __LP64__ !!!!
  CGContextSetShouldAntialias(fl_gc, true);
  CGContextAddArc(fl_gc, xt, yt, (w+h)*0.25f, 0, 2.0f*M_PI, 0);
  (what == POLYGON ? CGContextFillPath : CGContextStrokePath)(fl_gc);
  CGContextSetShouldAntialias(fl_gc, false);
#else
# error unsupported platform
#endif
}